

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

bool __thiscall
helics::CommonCore::enterInitializingMode
          (CommonCore *this,LocalFederateId federateID,IterationRequest request)

{
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  FederateStates FVar1;
  bool bVar2;
  undefined1 uVar3;
  IterationResult IVar4;
  FederateState *this_00;
  char *pcVar5;
  basic_string_view<char,_std::char_traits<char>_> *this_01;
  undefined8 uVar6;
  char in_DL;
  CommonCore *in_stack_00000038;
  LocalFederateId in_stack_00000044;
  IterationResult check;
  ActionMessage init;
  bool exp;
  FederateState *fed;
  ActionMessage *in_stack_fffffffffffffe68;
  undefined1 __i;
  BrokerBase *in_stack_fffffffffffffe70;
  undefined5 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7d;
  IterationResult IVar7;
  undefined1 in_stack_fffffffffffffe7e;
  undefined1 in_stack_fffffffffffffe7f;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  undefined2 in_stack_fffffffffffffe8c;
  undefined1 in_stack_fffffffffffffe8e;
  undefined1 in_stack_fffffffffffffe8f;
  char cVar8;
  ActionMessage *in_stack_fffffffffffffe90;
  CommonCore *in_stack_fffffffffffffea8;
  LocalFederateId in_stack_fffffffffffffeb4;
  memory_order in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  FederateState *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff74;
  CommonCore *in_stack_ffffffffffffff78;
  string_view in_stack_ffffffffffffff80;
  LocalFederateId in_stack_ffffffffffffff94;
  char local_11;
  bool local_1;
  
  this_00 = getFederateAt(in_stack_fffffffffffffea8,in_stack_fffffffffffffeb4);
  if (this_00 == (FederateState *)0x0) {
    pcVar5 = (char *)__cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffe80,
               (char *)CONCAT17(in_stack_fffffffffffffe7f,
                                CONCAT16(in_stack_fffffffffffffe7e,
                                         CONCAT15(in_stack_fffffffffffffe7d,
                                                  in_stack_fffffffffffffe78))));
    message._M_len._4_2_ = in_stack_fffffffffffffe8c;
    message._M_len._0_4_ = in_stack_fffffffffffffe88;
    message._M_len._6_1_ = in_stack_fffffffffffffe8e;
    message._M_len._7_1_ = in_stack_fffffffffffffe8f;
    message._M_str = pcVar5;
    InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)in_stack_fffffffffffffe80,message);
    __cxa_throw(pcVar5,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
  }
  cVar8 = in_DL;
  local_11 = in_DL;
  if ((byte)(in_DL - 1U) < 2) {
    bVar2 = FederateState::isCallbackFederate(this_00);
    if (bVar2) {
      local_11 = '\0';
    }
  }
  else {
    if (in_DL == '\x03') {
      finalize(in_stack_00000038,in_stack_00000044);
      return false;
    }
    if (in_DL == '\a') {
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe80,
                 (char *)CONCAT17(in_stack_fffffffffffffe7f,
                                  CONCAT16(in_stack_fffffffffffffe7e,
                                           CONCAT15(in_stack_fffffffffffffe7d,
                                                    in_stack_fffffffffffffe78))));
      localError(in_stack_ffffffffffffff78,in_stack_ffffffffffffff94,in_stack_ffffffffffffff74,
                 in_stack_ffffffffffffff80);
      return false;
    }
  }
  FVar1 = FederateState::getState((FederateState *)0x48e269);
  if (FVar1 == CREATED) {
    bVar2 = std::atomic<bool>::compare_exchange_strong
                      ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)
                       ,(bool *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                       (bool)in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8);
    if (!bVar2) {
      uVar6 = __cxa_allocate_exception(0x28);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe80,
                 (char *)CONCAT17(in_stack_fffffffffffffe7f,
                                  CONCAT16(in_stack_fffffffffffffe7e,
                                           CONCAT15(in_stack_fffffffffffffe7d,
                                                    in_stack_fffffffffffffe78))));
      message_02._M_len._4_2_ = in_stack_fffffffffffffe8c;
      message_02._M_len._0_4_ = in_stack_fffffffffffffe88;
      message_02._M_len._6_1_ = FVar1;
      message_02._M_len._7_1_ = cVar8;
      message_02._M_str = (char *)in_stack_fffffffffffffe90;
      InvalidFunctionCall::InvalidFunctionCall
                ((InvalidFunctionCall *)in_stack_fffffffffffffe80,message_02);
      __cxa_throw(uVar6,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
    }
    ActionMessage::ActionMessage
              (in_stack_fffffffffffffe90,CONCAT13(cVar8,CONCAT12(FVar1,in_stack_fffffffffffffe8c)));
    std::atomic<helics::GlobalFederateId>::load(&this_00->global_id,seq_cst);
    if (local_11 != '\0') {
      setIterationFlags((ActionMessage *)in_stack_fffffffffffffe70,
                        (IterationRequest)((ulong)in_stack_fffffffffffffe68 >> 0x38));
      std::atomic<bool>::store
                ((atomic<bool> *)
                 CONCAT17(in_stack_fffffffffffffe7f,
                          CONCAT16(in_stack_fffffffffffffe7e,
                                   CONCAT15(in_stack_fffffffffffffe7d,in_stack_fffffffffffffe78))),
                 SUB81((ulong)in_stack_fffffffffffffe70 >> 0x38,0),
                 (memory_order)in_stack_fffffffffffffe70);
      std::atomic<bool>::store
                ((atomic<bool> *)
                 CONCAT17(in_stack_fffffffffffffe7f,
                          CONCAT16(in_stack_fffffffffffffe7e,
                                   CONCAT15(in_stack_fffffffffffffe7d,in_stack_fffffffffffffe78))),
                 SUB81((ulong)in_stack_fffffffffffffe70 >> 0x38,0),
                 (memory_order)in_stack_fffffffffffffe70);
    }
    BrokerBase::addActionMessage(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    __i = (undefined1)((ulong)in_stack_fffffffffffffe68 >> 0x38);
    uVar3 = FederateState::isCallbackFederate(this_00);
    if ((bool)uVar3) {
      local_1 = false;
    }
    else {
      IVar4 = FederateState::enterInitializingMode
                        ((FederateState *)
                         CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffe7e,
                                                 CONCAT15(in_stack_fffffffffffffe7d,
                                                          in_stack_fffffffffffffe78))),
                         (IterationRequest)((ulong)in_stack_fffffffffffffe70 >> 0x38));
      IVar7 = IVar4;
      std::atomic<bool>::operator=((atomic<bool> *)in_stack_fffffffffffffe70,(bool)__i);
      if ((IVar7 != NEXT_STEP) && (IVar7 != ITERATING)) {
        if (IVar7 == HALTED) {
          uVar6 = __cxa_allocate_exception(0x28);
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffffe80,
                     (char *)CONCAT17(uVar3,CONCAT16(IVar4,CONCAT15(IVar7,in_stack_fffffffffffffe78)
                                                    )));
          message_01._M_len._4_2_ = in_stack_fffffffffffffe8c;
          message_01._M_len._0_4_ = in_stack_fffffffffffffe88;
          message_01._M_len._6_1_ = FVar1;
          message_01._M_len._7_1_ = cVar8;
          message_01._M_str = (char *)in_stack_fffffffffffffe90;
          HelicsSystemFailure::HelicsSystemFailure
                    ((HelicsSystemFailure *)in_stack_fffffffffffffe80,message_01);
          __cxa_throw(uVar6,&HelicsSystemFailure::typeinfo,HelicsSystemFailure::~HelicsSystemFailure
                     );
        }
        generateFederateException(in_stack_ffffffffffffff60);
      }
      local_1 = true;
    }
    ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffe70);
  }
  else {
    if ((FVar1 != INITIALIZING) || (local_11 != '\0')) {
      this_01 = (basic_string_view<char,_std::char_traits<char>_> *)__cxa_allocate_exception(0x28);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (this_01,(char *)CONCAT17(in_stack_fffffffffffffe7f,
                                          CONCAT16(in_stack_fffffffffffffe7e,
                                                   CONCAT15(in_stack_fffffffffffffe7d,
                                                            in_stack_fffffffffffffe78))));
      message_00._M_len._4_2_ = in_stack_fffffffffffffe8c;
      message_00._M_len._0_4_ = in_stack_fffffffffffffe88;
      message_00._M_len._6_1_ = FVar1;
      message_00._M_len._7_1_ = cVar8;
      message_00._M_str = (char *)in_stack_fffffffffffffe90;
      InvalidFunctionCall::InvalidFunctionCall((InvalidFunctionCall *)this_01,message_00);
      __cxa_throw(this_01,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool CommonCore::enterInitializingMode(LocalFederateId federateID, IterationRequest request)
{
    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("federateID not valid for Entering Init"));
    }
    switch (request) {
        case IterationRequest::HALT_OPERATIONS:
            return finalize(federateID), false;
        case IterationRequest::ERROR_CONDITION:
            return localError(federateID, 34, "error condition called in enterInitializingMode"),
                   false;
        case IterationRequest::FORCE_ITERATION:
        case IterationRequest::ITERATE_IF_NEEDED:
            if (fed->isCallbackFederate()) {
                // callback federates cannot iterate in startup
                request = IterationRequest::NO_ITERATIONS;
            }
            break;
        default:
            break;
    }
    switch (fed->getState()) {
        case FederateStates::CREATED:
            break;
        case FederateStates::INITIALIZING:
            if (request == IterationRequest::NO_ITERATIONS) {
                return false;
            }
            [[fallthrough]];
        default:
            throw(InvalidFunctionCall("May only enter initializing state from created state"));
    }

    bool exp = false;
    // only enter this loop once per federate
    if (fed->initRequested.compare_exchange_strong(exp, true)) {
        ActionMessage init(CMD_INIT);
        init.source_id = fed->global_id.load();
        if (request != IterationRequest::NO_ITERATIONS) {
            setIterationFlags(init, request);
            fed->initIterating.store(true);
            initIterations.store(true);
        }

        addActionMessage(init);

        if (fed->isCallbackFederate()) {
            return false;
        }
        auto check = fed->enterInitializingMode(request);
        fed->initRequested = false;
        switch (check) {
            case IterationResult::NEXT_STEP:
            case IterationResult::ITERATING:
                break;
            case IterationResult::HALTED:
                throw(HelicsSystemFailure());
            default:
                generateFederateException(fed);
                break;
        }

        return true;
    }
    throw(InvalidFunctionCall("federate already has requested entry to initializing State"));
}